

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorydata.cpp
# Opt level: O0

int __thiscall ncnn::MemoryData::load_model(MemoryData *this,ModelBin *mb)

{
  int *piVar1;
  void **ppvVar2;
  long *in_RSI;
  long in_RDI;
  bool bVar3;
  undefined7 in_stack_fffffffffffffc38;
  undefined1 in_stack_fffffffffffffc3f;
  size_t in_stack_fffffffffffffc40;
  undefined8 in_stack_fffffffffffffc48;
  void **ppvVar4;
  Mat *in_stack_fffffffffffffc50;
  void *local_338;
  int *local_330;
  long *local_318;
  void *local_2f0;
  int *local_2e8;
  long *local_2d0;
  void *local_2a8;
  int *local_2a0;
  long *local_288;
  void *local_250;
  int *local_248;
  long *local_230;
  int local_1f4;
  int local_1f0;
  undefined4 local_1ec;
  void **local_1e8;
  void **local_1e0;
  void **local_1d8;
  int local_1d0;
  undefined4 local_1cc;
  void **local_1c8;
  void **local_1c0;
  void **local_1b8;
  int local_1b0;
  undefined4 local_1ac;
  void **local_1a8;
  void **local_1a0;
  void **local_198;
  int local_190;
  undefined4 local_18c;
  void **local_188;
  void **local_180;
  void **local_178;
  void **local_170;
  void **local_160;
  void **local_150;
  void **local_140;
  int local_118;
  undefined4 local_114;
  void **local_110;
  int local_f8;
  undefined4 local_f4;
  void **local_f0;
  int local_d8;
  undefined4 local_d4;
  void **local_d0;
  int local_b8;
  undefined4 local_b4;
  void **local_b0;
  int local_a8;
  undefined4 local_a4;
  void **local_a0;
  int local_98;
  undefined4 local_94;
  void **local_90;
  int local_88;
  undefined4 local_84;
  void **local_80;
  int local_78;
  undefined4 local_74;
  void **local_70;
  void *local_68;
  void *local_60;
  void *local_58;
  void *local_50;
  
  if (*(int *)(in_RDI + 0xd8) == 0) {
    if (*(int *)(in_RDI + 0xdc) == 0) {
      if (*(int *)(in_RDI + 0xd4) == 0) {
        if (*(int *)(in_RDI + 0xd0) == 0) {
          Mat::create(in_stack_fffffffffffffc50,(int)((ulong)in_stack_fffffffffffffc48 >> 0x20),
                      in_stack_fffffffffffffc40,
                      (Allocator *)CONCAT17(in_stack_fffffffffffffc3f,in_stack_fffffffffffffc38));
        }
        else {
          (**(code **)(*in_RSI + 0x10))
                    (&local_338,in_RSI,*(undefined4 *)(in_RDI + 0xd0),*(undefined4 *)(in_RDI + 0xe0)
                    );
          ppvVar2 = (void **)(in_RDI + 0xe8);
          local_1e8 = &local_338;
          local_1e0 = ppvVar2;
          if (ppvVar2 != local_1e8) {
            if (local_330 != (int *)0x0) {
              local_1ec = 1;
              LOCK();
              local_1f0 = *local_330;
              *local_330 = *local_330 + 1;
              UNLOCK();
            }
            ppvVar4 = ppvVar2;
            local_70 = ppvVar2;
            if (*(long *)(in_RDI + 0xf0) != 0) {
              piVar1 = *(int **)(in_RDI + 0xf0);
              local_74 = 0xffffffff;
              LOCK();
              local_78 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_78 == 1) {
                if (*(long *)(in_RDI + 0x108) == 0) {
                  local_68 = *ppvVar2;
                  if (local_68 != (void *)0x0) {
                    free(local_68);
                  }
                }
                else {
                  (**(code **)(**(long **)(in_RDI + 0x108) + 0x18))
                            (*(long **)(in_RDI + 0x108),*ppvVar2);
                }
              }
            }
            *ppvVar4 = (void *)0x0;
            ppvVar4[2] = (void *)0x0;
            *(undefined4 *)(ppvVar4 + 3) = 0;
            *(undefined4 *)(ppvVar4 + 5) = 0;
            *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
            *(undefined4 *)(ppvVar4 + 6) = 0;
            *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
            *(undefined4 *)(ppvVar4 + 7) = 0;
            ppvVar4[8] = (void *)0x0;
            ppvVar4[1] = (void *)0x0;
            *ppvVar2 = *local_1e8;
            *(void **)(in_RDI + 0xf0) = local_1e8[1];
            *(void **)(in_RDI + 0xf8) = local_1e8[2];
            *(undefined4 *)(in_RDI + 0x100) = *(undefined4 *)(local_1e8 + 3);
            *(void **)(in_RDI + 0x108) = local_1e8[4];
            *(undefined4 *)(in_RDI + 0x110) = *(undefined4 *)(local_1e8 + 5);
            *(undefined4 *)(in_RDI + 0x114) = *(undefined4 *)((long)local_1e8 + 0x2c);
            *(undefined4 *)(in_RDI + 0x118) = *(undefined4 *)(local_1e8 + 6);
            *(undefined4 *)(in_RDI + 0x11c) = *(undefined4 *)((long)local_1e8 + 0x34);
            *(undefined4 *)(in_RDI + 0x120) = *(undefined4 *)(local_1e8 + 7);
            *(void **)(in_RDI + 0x128) = local_1e8[8];
          }
          ppvVar4 = &local_338;
          if (local_330 != (int *)0x0) {
            local_114 = 0xffffffff;
            LOCK();
            local_118 = *local_330;
            *local_330 = *local_330 + -1;
            UNLOCK();
            if (local_118 == 1) {
              local_1d8 = ppvVar2;
              local_140 = ppvVar4;
              local_110 = ppvVar4;
              if (local_318 == (long *)0x0) {
                if (local_338 != (void *)0x0) {
                  free(local_338);
                }
              }
              else {
                (**(code **)(*local_318 + 0x18))(local_318,local_338);
              }
            }
          }
          *ppvVar4 = (void *)0x0;
          ppvVar4[2] = (void *)0x0;
          *(undefined4 *)(ppvVar4 + 3) = 0;
          *(undefined4 *)(ppvVar4 + 5) = 0;
          *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
          *(undefined4 *)(ppvVar4 + 6) = 0;
          *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
          *(undefined4 *)(ppvVar4 + 7) = 0;
          ppvVar4[8] = (void *)0x0;
          ppvVar4[1] = (void *)0x0;
        }
      }
      else {
        (**(code **)(*in_RSI + 0x18))
                  (&local_2f0,in_RSI,*(undefined4 *)(in_RDI + 0xd0),*(undefined4 *)(in_RDI + 0xd4),
                   *(undefined4 *)(in_RDI + 0xe0));
        ppvVar2 = (void **)(in_RDI + 0xe8);
        local_1c8 = &local_2f0;
        local_1c0 = ppvVar2;
        if (ppvVar2 != local_1c8) {
          if (local_2e8 != (int *)0x0) {
            local_1cc = 1;
            LOCK();
            local_1d0 = *local_2e8;
            *local_2e8 = *local_2e8 + 1;
            UNLOCK();
          }
          local_80 = ppvVar2;
          if (*(long *)(in_RDI + 0xf0) != 0) {
            piVar1 = *(int **)(in_RDI + 0xf0);
            local_84 = 0xffffffff;
            LOCK();
            local_88 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_88 == 1) {
              if (*(long *)(in_RDI + 0x108) == 0) {
                local_60 = *ppvVar2;
                if (local_60 != (void *)0x0) {
                  free(local_60);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x108) + 0x18))
                          (*(long **)(in_RDI + 0x108),*ppvVar2);
              }
            }
          }
          *ppvVar2 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0xf8) = 0;
          *(undefined4 *)(in_RDI + 0x100) = 0;
          *(undefined4 *)(in_RDI + 0x110) = 0;
          *(undefined4 *)(in_RDI + 0x114) = 0;
          *(undefined4 *)(in_RDI + 0x118) = 0;
          *(undefined4 *)(in_RDI + 0x11c) = 0;
          *(undefined4 *)(in_RDI + 0x120) = 0;
          *(undefined8 *)(in_RDI + 0x128) = 0;
          *(undefined8 *)(in_RDI + 0xf0) = 0;
          *ppvVar2 = *local_1c8;
          *(void **)(in_RDI + 0xf0) = local_1c8[1];
          *(void **)(in_RDI + 0xf8) = local_1c8[2];
          *(undefined4 *)(in_RDI + 0x100) = *(undefined4 *)(local_1c8 + 3);
          *(void **)(in_RDI + 0x108) = local_1c8[4];
          *(undefined4 *)(in_RDI + 0x110) = *(undefined4 *)(local_1c8 + 5);
          *(undefined4 *)(in_RDI + 0x114) = *(undefined4 *)((long)local_1c8 + 0x2c);
          *(undefined4 *)(in_RDI + 0x118) = *(undefined4 *)(local_1c8 + 6);
          *(undefined4 *)(in_RDI + 0x11c) = *(undefined4 *)((long)local_1c8 + 0x34);
          *(undefined4 *)(in_RDI + 0x120) = *(undefined4 *)(local_1c8 + 7);
          *(void **)(in_RDI + 0x128) = local_1c8[8];
        }
        local_150 = &local_2f0;
        if (local_2e8 != (int *)0x0) {
          local_f4 = 0xffffffff;
          LOCK();
          local_f8 = *local_2e8;
          *local_2e8 = *local_2e8 + -1;
          UNLOCK();
          if (local_f8 == 1) {
            local_1b8 = ppvVar2;
            local_f0 = local_150;
            if (local_2d0 == (long *)0x0) {
              if (local_2f0 != (void *)0x0) {
                free(local_2f0);
              }
            }
            else {
              (**(code **)(*local_2d0 + 0x18))(local_2d0,local_2f0);
            }
          }
        }
      }
    }
    else {
      (**(code **)(*in_RSI + 0x20))
                (&local_2a8,in_RSI,*(undefined4 *)(in_RDI + 0xd0),*(undefined4 *)(in_RDI + 0xd4),
                 *(undefined4 *)(in_RDI + 0xdc),*(undefined4 *)(in_RDI + 0xe0));
      ppvVar2 = (void **)(in_RDI + 0xe8);
      local_1a8 = &local_2a8;
      local_1a0 = ppvVar2;
      if (ppvVar2 != local_1a8) {
        if (local_2a0 != (int *)0x0) {
          local_1ac = 1;
          LOCK();
          local_1b0 = *local_2a0;
          *local_2a0 = *local_2a0 + 1;
          UNLOCK();
        }
        local_90 = ppvVar2;
        if (*(long *)(in_RDI + 0xf0) != 0) {
          piVar1 = *(int **)(in_RDI + 0xf0);
          local_94 = 0xffffffff;
          LOCK();
          local_98 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_98 == 1) {
            if (*(long *)(in_RDI + 0x108) == 0) {
              local_58 = *ppvVar2;
              if (local_58 != (void *)0x0) {
                free(local_58);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x108) + 0x18))(*(long **)(in_RDI + 0x108),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0xf8) = 0;
        *(undefined4 *)(in_RDI + 0x100) = 0;
        *(undefined4 *)(in_RDI + 0x110) = 0;
        *(undefined4 *)(in_RDI + 0x114) = 0;
        *(undefined4 *)(in_RDI + 0x118) = 0;
        *(undefined4 *)(in_RDI + 0x11c) = 0;
        *(undefined4 *)(in_RDI + 0x120) = 0;
        *(undefined8 *)(in_RDI + 0x128) = 0;
        *(undefined8 *)(in_RDI + 0xf0) = 0;
        *ppvVar2 = *local_1a8;
        *(void **)(in_RDI + 0xf0) = local_1a8[1];
        *(void **)(in_RDI + 0xf8) = local_1a8[2];
        *(undefined4 *)(in_RDI + 0x100) = *(undefined4 *)(local_1a8 + 3);
        *(void **)(in_RDI + 0x108) = local_1a8[4];
        *(undefined4 *)(in_RDI + 0x110) = *(undefined4 *)(local_1a8 + 5);
        *(undefined4 *)(in_RDI + 0x114) = *(undefined4 *)((long)local_1a8 + 0x2c);
        *(undefined4 *)(in_RDI + 0x118) = *(undefined4 *)(local_1a8 + 6);
        *(undefined4 *)(in_RDI + 0x11c) = *(undefined4 *)((long)local_1a8 + 0x34);
        *(undefined4 *)(in_RDI + 0x120) = *(undefined4 *)(local_1a8 + 7);
        *(void **)(in_RDI + 0x128) = local_1a8[8];
      }
      local_160 = &local_2a8;
      if (local_2a0 != (int *)0x0) {
        local_d4 = 0xffffffff;
        LOCK();
        local_d8 = *local_2a0;
        *local_2a0 = *local_2a0 + -1;
        UNLOCK();
        if (local_d8 == 1) {
          local_198 = ppvVar2;
          local_d0 = local_160;
          if (local_288 == (long *)0x0) {
            if (local_2a8 != (void *)0x0) {
              free(local_2a8);
            }
          }
          else {
            (**(code **)(*local_288 + 0x18))(local_288,local_2a8);
          }
        }
      }
    }
  }
  else {
    (**(code **)(*in_RSI + 0x28))
              (&local_250,in_RSI,*(undefined4 *)(in_RDI + 0xd0),*(undefined4 *)(in_RDI + 0xd4),
               *(undefined4 *)(in_RDI + 0xd8),*(undefined4 *)(in_RDI + 0xdc),
               *(undefined4 *)(in_RDI + 0xe0));
    ppvVar2 = (void **)(in_RDI + 0xe8);
    local_188 = &local_250;
    local_180 = ppvVar2;
    if (ppvVar2 != local_188) {
      if (local_248 != (int *)0x0) {
        local_18c = 1;
        LOCK();
        local_190 = *local_248;
        *local_248 = *local_248 + 1;
        UNLOCK();
      }
      local_a0 = ppvVar2;
      if (*(long *)(in_RDI + 0xf0) != 0) {
        piVar1 = *(int **)(in_RDI + 0xf0);
        local_a4 = 0xffffffff;
        LOCK();
        local_a8 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_a8 == 1) {
          if (*(long *)(in_RDI + 0x108) == 0) {
            local_50 = *ppvVar2;
            if (local_50 != (void *)0x0) {
              free(local_50);
            }
          }
          else {
            (**(code **)(**(long **)(in_RDI + 0x108) + 0x18))(*(long **)(in_RDI + 0x108),*ppvVar2);
          }
        }
      }
      *ppvVar2 = (void *)0x0;
      *(undefined8 *)(in_RDI + 0xf8) = 0;
      *(undefined4 *)(in_RDI + 0x100) = 0;
      *(undefined4 *)(in_RDI + 0x110) = 0;
      *(undefined4 *)(in_RDI + 0x114) = 0;
      *(undefined4 *)(in_RDI + 0x118) = 0;
      *(undefined4 *)(in_RDI + 0x11c) = 0;
      *(undefined4 *)(in_RDI + 0x120) = 0;
      *(undefined8 *)(in_RDI + 0x128) = 0;
      *(undefined8 *)(in_RDI + 0xf0) = 0;
      *ppvVar2 = *local_188;
      *(void **)(in_RDI + 0xf0) = local_188[1];
      *(void **)(in_RDI + 0xf8) = local_188[2];
      *(undefined4 *)(in_RDI + 0x100) = *(undefined4 *)(local_188 + 3);
      *(void **)(in_RDI + 0x108) = local_188[4];
      *(undefined4 *)(in_RDI + 0x110) = *(undefined4 *)(local_188 + 5);
      *(undefined4 *)(in_RDI + 0x114) = *(undefined4 *)((long)local_188 + 0x2c);
      *(undefined4 *)(in_RDI + 0x118) = *(undefined4 *)(local_188 + 6);
      *(undefined4 *)(in_RDI + 0x11c) = *(undefined4 *)((long)local_188 + 0x34);
      *(undefined4 *)(in_RDI + 0x120) = *(undefined4 *)(local_188 + 7);
      *(void **)(in_RDI + 0x128) = local_188[8];
    }
    local_170 = &local_250;
    if (local_248 != (int *)0x0) {
      local_b4 = 0xffffffff;
      LOCK();
      local_b8 = *local_248;
      *local_248 = *local_248 + -1;
      UNLOCK();
      if (local_b8 == 1) {
        local_178 = ppvVar2;
        local_b0 = local_170;
        if (local_230 == (long *)0x0) {
          if (local_250 != (void *)0x0) {
            free(local_250);
          }
        }
        else {
          (**(code **)(*local_230 + 0x18))(local_230,local_250);
        }
      }
    }
  }
  bVar3 = true;
  if (*(long *)(in_RDI + 0xe8) != 0) {
    bVar3 = *(long *)(in_RDI + 0x128) * (long)*(int *)(in_RDI + 0x120) == 0;
  }
  if (bVar3) {
    local_1f4 = -100;
  }
  else {
    local_1f4 = 0;
  }
  return local_1f4;
}

Assistant:

int MemoryData::load_model(const ModelBin& mb)
{
    if (d != 0)
    {
        data = mb.load(w, h, d, c, load_type);
    }
    else if (c != 0)
    {
        data = mb.load(w, h, c, load_type);
    }
    else if (h != 0)
    {
        data = mb.load(w, h, load_type);
    }
    else if (w != 0)
    {
        data = mb.load(w, load_type);
    }
    else // 0 0 0
    {
        data.create(1);
    }
    if (data.empty())
        return -100;

    return 0;
}